

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

void __thiscall fmp4_stream::tfhd::tfhd(tfhd *this)

{
  allocator local_41;
  string local_40 [48];
  tfhd *local_10;
  tfhd *this_local;
  
  local_10 = this;
  full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00144430;
  set_zero(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"tfhd",&local_41);
  std::__cxx11::string::operator=((string *)&(this->super_full_box).super_box.box_type_,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void set_zero() 
		{
			base_data_offset_present_=false;
			sample_description_index_present_=false;
			default_sample_duration_present_=false;
			default_sample_size_present_=false;
			default_sample_flags_present_=false;
			duration_is_empty_=false;
			default_base_is_moof_=false;

			track_id_=0;
			base_data_offset_=0;
			sample_description_index_=0;
			default_sample_duration_=0;
			default_sample_size_=0;
			default_sample_flags_=0;
		}